

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::S_formatter<spdlog::details::null_scoped_padder>::format
          (S_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  null_scoped_padder local_31;
  undefined8 uStack_30;
  null_scoped_padder p;
  size_t field_size;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *param_1_local;
  S_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  uStack_30 = 2;
  null_scoped_padder::null_scoped_padder(&local_31,2,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::pad2(tm_time->tm_sec,dest);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_sec, dest);
    }